

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Linear_Object_State_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Linear_Object_State_PDU::Linear_Object_State_PDU(Linear_Object_State_PDU *this)

{
  Linear_Object_State_PDU *this_local;
  
  Object_State_Header::Object_State_Header(&this->super_Object_State_Header);
  (this->super_Object_State_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Linear_Object_State_PDU_0032f368;
  (this->super_Object_State_Header).field_0x4b = 0;
  DATA_TYPE::SimulationIdentifier::SimulationIdentifier(&this->m_ReqID);
  DATA_TYPE::SimulationIdentifier::SimulationIdentifier(&this->m_RecvID);
  DATA_TYPE::ObjectType::ObjectType(&this->m_ObjTyp);
  std::
  vector<KDIS::DATA_TYPE::LinearSegmentParameter,_std::allocator<KDIS::DATA_TYPE::LinearSegmentParameter>_>
  ::vector(&this->m_vSegments);
  (this->super_Object_State_Header).super_Header.super_Header6.m_ui8PDUType = ',';
  (this->super_Object_State_Header).super_Header.super_Header6.m_ui16PDULength = 0x28;
  return;
}

Assistant:

Linear_Object_State_PDU::Linear_Object_State_PDU() :
    m_ui8NumSegment( 0 )
{
    m_ui8PDUType = LinearObjectState_PDU_Type;
    m_ui16PDULength = LINEAR_OBJECT_STATE_PDU_SIZE;
}